

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_CreateBoxTest(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  Vec_Int_t *vAdds;
  abctime aVar8;
  Vec_Wec_t *p_00;
  Vec_Int_t *vTree;
  Acec_Box_t *pBox_00;
  abctime time;
  abctime time_00;
  char *pcVar9;
  uint i;
  Acec_Box_t *pBox;
  
  aVar7 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar2 = Ree_ManCountFadds(vAdds);
  pcVar9 = (char *)((long)vAdds->nSize / 6 & 0xffffffff);
  printf("Detected %d adders (%d FAs and %d HAs).  ",pcVar9,(ulong)uVar2);
  aVar8 = Abc_Clock();
  Abc_PrintTime((int)aVar8 - (int)aVar7,pcVar9,time);
  aVar7 = Abc_Clock();
  p_00 = Acec_TreeFindTrees(p,vAdds,(Vec_Bit_t *)0x0,0,0);
  uVar2 = p_00->nSize;
  iVar3 = Vec_WecSizeSize(p_00);
  pcVar9 = (char *)(ulong)uVar2;
  printf("Collected %d trees with %d adders in them.  ",pcVar9,(long)iVar3 / 2 & 0xffffffff);
  aVar8 = Abc_Clock();
  Abc_PrintTime((int)aVar8 - (int)aVar7,pcVar9,time_00);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (i = 0; uVar2 != i; i = i + 1) {
    Vec_WecEntry(p_00,i);
    vTree = Vec_WecEntry(p_00,i);
    pBox_00 = Acec_CreateBox(p,vAdds,vTree);
    uVar1 = pBox_00->vAdds->nSize;
    pBox = pBox_00;
    uVar4 = Vec_WecSizeSize(pBox_00->vAdds);
    uVar5 = Vec_WecSizeSize(pBox_00->vLeafLits);
    uVar6 = Vec_WecSizeSize(pBox_00->vRootLits);
    printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",(ulong)i,
           (ulong)uVar1,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    Acec_TreePrintBox(pBox_00,vAdds);
    Acec_BoxFreeP(&pBox);
  }
  Vec_WecFree(p_00);
  Vec_IntFree(vAdds);
  return;
}

Assistant:

void Acec_CreateBoxTest( Gia_Man_t * p )
{
    Acec_Box_t * pBox;
    Vec_Wec_t * vTrees;
    Vec_Int_t * vTree;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    //Vec_WecPrint( vTrees, 0 );

    Vec_WecForEachLevel( vTrees, vTree, i )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, i) );
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            i, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
        Acec_TreePrintBox( pBox, vAdds );
        Acec_BoxFreeP( &pBox );
    }

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}